

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# to_interval.cpp
# Opt level: O0

ScalarFunctionSet * duckdb::GetIntegerIntervalFunctions<duckdb::ToQuartersOperator>(void)

{
  initializer_list<duckdb::LogicalType> iVar1;
  initializer_list<duckdb::LogicalType> iVar2;
  bool bVar3;
  ScalarFunctionSet *in_RDI;
  ScalarFunction *func;
  iterator __end2;
  iterator __begin2;
  vector<duckdb::ScalarFunction,_true> *__range2;
  ScalarFunctionSet *function_set;
  allocator_type *in_stack_fffffffffffffab8;
  ScalarFunction *pSVar4;
  vector<duckdb::LogicalType,_true> *in_stack_fffffffffffffac0;
  ScalarFunction *pSVar5;
  _func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *in_stack_fffffffffffffac8;
  LogicalType *__f;
  undefined4 in_stack_fffffffffffffad0;
  undefined4 uVar6;
  undefined4 in_stack_fffffffffffffad4;
  LogicalType *local_4b8;
  LogicalType *local_498;
  BaseScalarFunction local_478 [176];
  reference local_3c8;
  ScalarFunction *local_3c0;
  __normal_iterator<duckdb::ScalarFunction_*,_std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>_>
  local_3b8;
  ScalarFunctionSet *local_3b0;
  LogicalType local_3a8 [24];
  undefined1 local_390 [32];
  LogicalType local_370 [32];
  LogicalType *local_350;
  LogicalType local_348 [24];
  LogicalType *local_330;
  undefined8 local_328;
  undefined1 local_320 [24];
  ScalarFunction local_308;
  LogicalType local_1e0 [24];
  undefined1 local_1c8 [32];
  LogicalType local_1a8 [40];
  LogicalType *local_180;
  LogicalType local_178 [24];
  LogicalType *local_160;
  undefined8 local_158;
  undefined1 local_150 [24];
  ScalarFunction local_138;
  undefined1 local_9;
  
  local_9 = 0;
  duckdb::ScalarFunctionSet::ScalarFunctionSet(in_RDI);
  local_180 = local_178;
  duckdb::LogicalType::LogicalType(local_180,INTEGER);
  local_160 = local_178;
  local_158 = 1;
  std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0xc1d9dc);
  iVar1._M_len._0_4_ = in_stack_fffffffffffffad0;
  iVar1._M_array = (iterator)in_stack_fffffffffffffac8;
  iVar1._M_len._4_4_ = in_stack_fffffffffffffad4;
  vector<duckdb::LogicalType,_true>::vector
            (in_stack_fffffffffffffac0,iVar1,in_stack_fffffffffffffab8);
  duckdb::LogicalType::LogicalType(local_1a8,INTERVAL);
  std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
  function<void(&)(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&),void>
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0),in_stack_fffffffffffffac8
            );
  duckdb::LogicalType::LogicalType(local_1e0,INVALID);
  __f = local_1e0;
  uVar6 = 0;
  pSVar5 = (ScalarFunction *)0x0;
  pSVar4 = (ScalarFunction *)0x0;
  duckdb::ScalarFunction::ScalarFunction(&local_138,local_150,local_1a8,local_1c8,0);
  FunctionSet<duckdb::ScalarFunction>::AddFunction
            ((FunctionSet<duckdb::ScalarFunction> *)pSVar5,pSVar4);
  ScalarFunction::~ScalarFunction(pSVar5);
  duckdb::LogicalType::~LogicalType(local_1e0);
  std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::~function
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             0xc1dadd);
  duckdb::LogicalType::~LogicalType(local_1a8);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0xc1daf7);
  std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0xc1db04);
  local_498 = (LogicalType *)&local_160;
  do {
    local_498 = local_498 + -0x18;
    duckdb::LogicalType::~LogicalType(local_498);
  } while (local_498 != local_178);
  local_350 = local_348;
  duckdb::LogicalType::LogicalType(local_350,BIGINT);
  local_330 = local_348;
  local_328 = 1;
  std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0xc1dba3);
  iVar2._M_len._0_4_ = uVar6;
  iVar2._M_array = __f;
  iVar2._M_len._4_4_ = in_stack_fffffffffffffad4;
  vector<duckdb::LogicalType,_true>::vector
            ((vector<duckdb::LogicalType,_true> *)pSVar5,iVar2,(allocator_type *)pSVar4);
  duckdb::LogicalType::LogicalType(local_370,INTERVAL);
  std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
  function<void(&)(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&),void>
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             CONCAT44(in_stack_fffffffffffffad4,uVar6),
             (_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *)__f);
  duckdb::LogicalType::LogicalType(local_3a8,INVALID);
  pSVar5 = (ScalarFunction *)0x0;
  pSVar4 = (ScalarFunction *)0x0;
  duckdb::ScalarFunction::ScalarFunction(&local_308,local_320,local_370,local_390,0);
  FunctionSet<duckdb::ScalarFunction>::AddFunction
            ((FunctionSet<duckdb::ScalarFunction> *)pSVar5,pSVar4);
  ScalarFunction::~ScalarFunction(pSVar5);
  duckdb::LogicalType::~LogicalType(local_3a8);
  std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::~function
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             0xc1dca4);
  duckdb::LogicalType::~LogicalType(local_370);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0xc1dcbe);
  std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0xc1dccb);
  local_4b8 = (LogicalType *)&local_330;
  do {
    local_4b8 = local_4b8 + -0x18;
    duckdb::LogicalType::~LogicalType(local_4b8);
  } while (local_4b8 != local_348);
  local_3b0 = in_RDI + 0x20;
  local_3b8._M_current =
       (ScalarFunction *)
       std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::begin(pSVar4);
  local_3c0 = (ScalarFunction *)
              std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::end
                        ((vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *)
                         pSVar4);
  while (bVar3 = __gnu_cxx::operator!=
                           ((__normal_iterator<duckdb::ScalarFunction_*,_std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>_>
                             *)pSVar5,
                            (__normal_iterator<duckdb::ScalarFunction_*,_std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>_>
                             *)pSVar4), bVar3) {
    local_3c8 = __gnu_cxx::
                __normal_iterator<duckdb::ScalarFunction_*,_std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>_>
                ::operator*(&local_3b8);
    BaseScalarFunction::SetReturnsError(&pSVar4->super_BaseScalarFunction);
    duckdb::BaseScalarFunction::~BaseScalarFunction(local_478);
    __gnu_cxx::
    __normal_iterator<duckdb::ScalarFunction_*,_std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>_>
    ::operator++(&local_3b8);
  }
  return in_RDI;
}

Assistant:

ScalarFunctionSet GetIntegerIntervalFunctions() {
	ScalarFunctionSet function_set;
	function_set.AddFunction(ScalarFunction({LogicalType::INTEGER}, LogicalType::INTERVAL,
	                                        ScalarFunction::UnaryFunction<int32_t, interval_t, OP>));
	function_set.AddFunction(ScalarFunction({LogicalType::BIGINT}, LogicalType::INTERVAL,
	                                        ScalarFunction::UnaryFunction<int64_t, interval_t, OP>));
	for (auto &func : function_set.functions) {
		BaseScalarFunction::SetReturnsError(func);
	}
	return function_set;
}